

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

double av1_convert_qindex_to_q(int qindex,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  double dVar2;
  
  if (bit_depth == AOM_BITS_8) {
    dVar2 = 0.25;
  }
  else if (bit_depth == AOM_BITS_12) {
    dVar2 = 0.015625;
  }
  else {
    if (bit_depth != AOM_BITS_10) {
      return -1.0;
    }
    dVar2 = 0.0625;
  }
  iVar1 = av1_ac_quant_QTX(qindex,0,bit_depth);
  return (double)(int)iVar1 * dVar2;
}

Assistant:

double av1_convert_qindex_to_q(int qindex, aom_bit_depth_t bit_depth) {
  // Convert the index to a real Q value (scaled down to match old Q values)
  switch (bit_depth) {
    case AOM_BITS_8: return av1_ac_quant_QTX(qindex, 0, bit_depth) / 4.0;
    case AOM_BITS_10: return av1_ac_quant_QTX(qindex, 0, bit_depth) / 16.0;
    case AOM_BITS_12: return av1_ac_quant_QTX(qindex, 0, bit_depth) / 64.0;
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1.0;
  }
}